

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep2.c
# Opt level: O0

MPP_RET iep2_start(iep2_api_ctx *ctx)

{
  uint uVar1;
  MPP_RET MVar2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  MPP_RET *pMVar6;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 local_48;
  undefined4 local_44;
  MppReqV1 mpp_req [2];
  MPP_RET ret;
  iep2_api_ctx *ctx_local;
  
  if ((ctx == (iep2_api_ctx *)0x0) &&
     (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"ctx","iep2_start",
                 CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),0x17c)),
     (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  local_48 = 0x200;
  local_44 = 1;
  mpp_req[0].cmd = 0x290;
  mpp_req[0].flag = 0;
  mpp_req[0].data_ptr._0_4_ = 0x201;
  mpp_req[0].data_ptr._4_4_ = 3;
  mpp_req[1].cmd = 0x19c;
  mpp_req[1].flag = 0;
  mpp_req[1]._8_8_ = &ctx->output;
  mpp_req[0]._8_8_ = ctx;
  if ((iep_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"iep:in\n",(char *)0x0);
  }
  MVar2 = ioctl(ctx->fd,0x40047601,&local_48);
  mpp_req[1].data_ptr._4_4_ = MVar2;
  if (MVar2 != MPP_OK) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    _mpp_log_l(2,(char *)0x0,"ioctl SET_REG failed ret %d errno %d %s\n","iep2_start",
               (ulong)(uint)MVar2,(ulong)uVar1,pcVar5);
    pMVar6 = __errno_location();
    mpp_req[1].data_ptr._4_4_ = *pMVar6;
  }
  return mpp_req[1].data_ptr._4_4_;
}

Assistant:

static MPP_RET iep2_start(struct iep2_api_ctx *ctx)
{
    MPP_RET ret;
    MppReqV1 mpp_req[2];

    mpp_assert(ctx);

    mpp_req[0].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[0].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[0].size =  sizeof(ctx->params);
    mpp_req[0].offset = 0;
    mpp_req[0].data_ptr = REQ_DATA_PTR(&ctx->params);

    mpp_req[1].cmd = MPP_CMD_SET_REG_READ;
    mpp_req[1].flag = MPP_FLAGS_MULTI_MSG | MPP_FLAGS_LAST_MSG;
    mpp_req[1].size =  sizeof(ctx->output);
    mpp_req[1].offset = 0;
    mpp_req[1].data_ptr = REQ_DATA_PTR(&ctx->output);

    iep_dbg_func("in\n");

    ret = (RK_S32)ioctl(ctx->fd, MPP_IOC_CFG_V1, &mpp_req[0]);

    if (ret) {
        mpp_err_f("ioctl SET_REG failed ret %d errno %d %s\n",
                  ret, errno, strerror(errno));
        ret = errno;
    }

    return ret;
}